

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O3

void __thiscall QSocks5SocketEnginePrivate::emitReadNotification(QSocks5SocketEnginePrivate *this)

{
  QObject *pQVar1;
  long in_FS_OFFSET;
  void *local_28;
  char *pcStack_20;
  QMetaTypeInterface *local_18 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&(this->super_QAbstractSocketEnginePrivate).field_0x8;
  this->readNotificationActivated = true;
  if ((this->readNotificationEnabled == true) && (this->readNotificationPending == false)) {
    this->readNotificationPending = true;
    local_28 = (void *)0x0;
    pcStack_20 = (char *)0x0;
    local_18[0] = (QMetaTypeInterface *)0x0;
    QMetaObject::invokeMethodImpl
              (pQVar1,"_q_emitPendingReadNotification",QueuedConnection,1,&local_28,&pcStack_20,
               local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSocks5SocketEnginePrivate::emitReadNotification()
{
    Q_Q(QSocks5SocketEngine);
    readNotificationActivated = true;
    if (readNotificationEnabled && !readNotificationPending) {
        QSOCKS5_D_DEBUG << "queueing readNotification";
        readNotificationPending = true;
        QMetaObject::invokeMethod(q, "_q_emitPendingReadNotification", Qt::QueuedConnection);
    }
}